

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall
Commands::command_handler_register::Register
          (command_handler_register *this,command_handler *handler,int flags)

{
  ulong uVar1;
  ulong uVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>,_bool>
  pVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>
  local_c0;
  
  uVar1 = (handler->info).partial_min_chars;
  if (uVar1 == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = (handler->info).name._M_string_length;
    if (uVar1 <= uVar2) goto LAB_0011e2ae;
  }
  (handler->info).partial_min_chars = uVar2;
LAB_0011e2ae:
  if ((flags & 1U) != 0) {
    (handler->info).duty_restrict = true;
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Commands::command_handler_&,_true>
            (&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)handler,
             handler);
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Commands::command_handler>,std::_Select1st<std::pair<std::__cxx11::string_const,Commands::command_handler>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Commands::command_handler>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,Commands::command_handler>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Commands::command_handler>,std::_Select1st<std::pair<std::__cxx11::string_const,Commands::command_handler>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Commands::command_handler>>>
                      *)this,&local_c0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>
  ::~pair(&local_c0);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    Console::Wrn("Duplicate command name: %s",(handler->info).name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void command_handler_register::Register(command_handler handler, int flags)
{
	if (handler.info.partial_min_chars < 1)
		handler.info.partial_min_chars = 1;
	else if (handler.info.partial_min_chars > handler.info.name.length())
		handler.info.partial_min_chars = handler.info.name.length();

	if (flags & CMD_FLAG_DUTY_RESTRICT)
		handler.info.duty_restrict = true;

	auto result = handlers.insert(std::make_pair(handler.info.name, handler));

	if (!result.second)
		Console::Wrn("Duplicate command name: %s", handler.info.name.c_str());
}